

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O1

Hop_Man_t * Abc_NtkHaigReconstruct(Hop_Man_t *p)

{
  void *pvVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  Hop_Man_t *p_00;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Hop_Obj_t *pHVar7;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  long *plVar11;
  int iVar12;
  
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)pVVar5->pArray[lVar4] + 8) = 0;
      lVar4 = lVar4 + 1;
      pVVar5 = p->vObjs;
    } while (lVar4 < pVVar5->nSize);
  }
  ppvVar6 = (void **)0x0;
  p_00 = Hop_ManStart();
  iVar3 = p->nCreated;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar12 = 8;
  if (6 < iVar3 - 1U) {
    iVar12 = iVar3;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar12;
  if (iVar12 != 0) {
    ppvVar6 = (void **)malloc((long)iVar12 << 3);
  }
  pVVar5->pArray = ppvVar6;
  p_00->vObjs = pVVar5;
  pHVar7 = p_00->pConst1;
  if (iVar12 == 0) {
    if (ppvVar6 == (void **)0x0) {
      ppvVar6 = (void **)malloc(0x80);
    }
    else {
      ppvVar6 = (void **)realloc(ppvVar6,0x80);
    }
    pVVar5->pArray = ppvVar6;
    pVVar5->nCap = 0x10;
  }
  pVVar5->nSize = 1;
  *pVVar5->pArray = pHVar7;
  p->pConst1->field_1 = (anon_union_8_2_6d2434d6_for_Hop_Obj_t__2)p_00->pConst1;
  pVVar5 = p->vPis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar4];
      pHVar7 = Hop_ObjCreatePi(p_00);
      *(Hop_Obj_t **)((long)pvVar1 + 8) = pHVar7;
      lVar4 = lVar4 + 1;
      pVVar5 = p->vPis;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      plVar11 = (long *)pVVar5->pArray[lVar4];
      if ((*(uint *)(plVar11 + 4) & 6) == 4) {
        plVar9 = (long *)(plVar11[2] & 0xfffffffffffffffe);
        uVar8 = plVar9[1];
        if (uVar8 == 0) goto LAB_00872f8a;
        plVar2 = (long *)*plVar9;
        if (plVar2 != (long *)0x0) {
          if ((long *)*plVar2 != plVar2) goto LAB_00872fa9;
          uVar8 = (ulong)((*(uint *)(plVar2 + 4) ^ *(uint *)(plVar9 + 4)) >> 3 & 1) ^ plVar2[1];
        }
        plVar9 = (long *)(plVar11[3] & 0xfffffffffffffffe);
        uVar10 = plVar9[1];
        if (uVar10 == 0) goto LAB_00872f8a;
        plVar2 = (long *)*plVar9;
        if (plVar2 != (long *)0x0) {
          if ((long *)*plVar2 != plVar2) goto LAB_00872fa9;
          uVar10 = (ulong)((*(uint *)(plVar2 + 4) ^ *(uint *)(plVar9 + 4)) >> 3 & 1) ^ plVar2[1];
        }
        pHVar7 = Hop_And(p_00,(Hop_Obj_t *)((uint)plVar11[2] & 1 ^ uVar8),
                         (Hop_Obj_t *)((uint)plVar11[3] & 1 ^ uVar10));
        plVar11[1] = (long)pHVar7;
        if (*plVar11 != 0) {
          *(ulong *)((ulong)pHVar7 & 0xfffffffffffffffe) =
               *(ulong *)(*plVar11 + 8) & 0xfffffffffffffffe;
        }
      }
      lVar4 = lVar4 + 1;
      pVVar5 = p->vObjs;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = p->vPos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      uVar8 = *(ulong *)((long)pVVar5->pArray[lVar4] + 0x10);
      plVar11 = (long *)(uVar8 & 0xfffffffffffffffe);
      uVar10 = plVar11[1];
      if (uVar10 == 0) {
LAB_00872f8a:
        __assert_fail("pObj->pNext != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0xbd,"Hop_Obj_t *Hop_ObjReprHop(Hop_Obj_t *)");
      }
      plVar9 = (long *)*plVar11;
      if (plVar9 != (long *)0x0) {
        if ((long *)*plVar9 != plVar9) {
LAB_00872fa9:
          __assert_fail("pRepr->pData == pRepr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                        ,0xc1,"Hop_Obj_t *Hop_ObjReprHop(Hop_Obj_t *)");
        }
        uVar10 = (ulong)((*(uint *)(plVar9 + 4) ^ *(uint *)(plVar11 + 4)) >> 3 & 1) ^ plVar9[1];
      }
      Hop_ObjCreatePo(p_00,(Hop_Obj_t *)((uint)uVar8 & 1 ^ uVar10));
      lVar4 = lVar4 + 1;
      pVVar5 = p->vPos;
    } while (lVar4 < pVVar5->nSize);
  }
  iVar3 = Hop_ManCheck(p_00);
  if (iVar3 == 0) {
    puts("Abc_NtkHaigReconstruct: Check for History AIG has failed.");
    Hop_ManStop(p_00);
    p_00 = (Hop_Man_t *)0x0;
  }
  return p_00;
}

Assistant:

Hop_Man_t * Abc_NtkHaigReconstruct( Hop_Man_t * p )
{ 
    Hop_Man_t * pNew;
    Hop_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
        pObj->pNext = NULL;
    // start the HOP package
    pNew = Hop_ManStart();
    pNew->vObjs = Vec_PtrAlloc( p->nCreated );
    Vec_PtrPush( pNew->vObjs, Hop_ManConst1(pNew) );
    // map the constant node
    Hop_ManConst1(p)->pNext = Hop_ManConst1(pNew);
    // map the CIs
    Hop_ManForEachPi( p, pObj, i )
        pObj->pNext = Hop_ObjCreatePi(pNew);
    // map the internal nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( !Hop_ObjIsNode(pObj) )
            continue;
        pObj->pNext = Hop_And( pNew, Hop_ObjChild0Hop(pObj), Hop_ObjChild1Hop(pObj) );
//        assert( !Hop_IsComplement(pObj->pNext) );
        if ( Hop_ManConst1(pNew) == Hop_Regular(pObj->pNext) )
            Counter++;
        if ( pObj->pData ) // member of the class
            Hop_Regular(pObj->pNext)->pData = Hop_Regular(((Hop_Obj_t *)pObj->pData)->pNext);
    }
//    printf( " Counter = %d.\n", Counter );
    // transfer the POs
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjCreatePo( pNew, Hop_ObjChild0Hop(pObj) );
    // check the new manager
    if ( !Hop_ManCheck(pNew) )
    {
        printf( "Abc_NtkHaigReconstruct: Check for History AIG has failed.\n" );
        Hop_ManStop(pNew);
        return NULL;
    }
    return pNew;
}